

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>,_std::unique_ptr<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>,_std::default_delete<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>_>_>
* __thiscall
pybind11::class_<std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::
vector<long,std::allocator<long>>>>,std::unique_ptr<std::vector<std::vector<long,std::
allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>,std::default_delete<std::
vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::
allocator<long>>>>>>>::def<bool(*)(std::vector<std::vector<long,std::allocator<long>>,std::
allocator<std::vector<long,std::allocator<long>>>>const&,std::vector<std::vector<long,std::
allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>const&),pybind11::operator>
          (allocator<long>>>>const___pybind11 *this,char *name_,
          _func_bool_vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_ptr_vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_ptr
          **f,is_operator *extra)

{
  _func_bool_vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_ptr_vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_ptr
  *f_00;
  cpp_function cf;
  handle local_50;
  cpp_function local_48;
  object local_40;
  is_method local_38;
  name local_30;
  sibling local_28;
  
  f_00 = *f;
  local_38.class_.m_ptr = *(handle *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_30.value = name_;
  getattr((pybind11 *)&local_50,local_38.class_,name_,(PyObject *)&_Py_NoneStruct);
  local_28.value.m_ptr = (handle)(handle)local_50.m_ptr;
  cpp_function::cpp_function<bool,std::vector<std::vector<long,std::allocator<long>>,std::
  allocator<std::vector<long,std::allocator<long>>>>const&,std::vector<std::vector<long,std::
  allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>const&,pybind11::
  name,pybind11::is_method,pybind11::sibling,pybind11::operator>
            ((sibling_pybind11 *)&local_48,f_00,&local_30,&local_38,&local_28,extra);
  object::~object((object *)&local_50);
  object::~object(&local_40);
  detail::add_class_method((object *)this,name_,&local_48);
  object::~object((object *)&local_48);
  return (class_<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>,_std::unique_ptr<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>,_std::default_delete<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }